

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O3

bool absl::debugging_internal::ParseUnresolvedName(State *state)

{
  ParseState *pPVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  bool bVar8;
  ParseState copy;
  
  iVar7 = state->recursion_depth;
  iVar2 = state->steps;
  state->recursion_depth = iVar7 + 1;
  state->steps = iVar2 + 1;
  if (0x1ffff < iVar2 || 0xff < iVar7) {
    bVar8 = false;
    goto LAB_00267e87;
  }
  uVar3 = (state->parse_state).mangled_idx;
  uVar4 = (state->parse_state).out_cur_idx;
  uVar5 = *(undefined8 *)&(state->parse_state).prev_name_idx;
  ParseTwoCharToken(state,"gs");
  bVar6 = ParseBaseUnresolvedName(state);
  bVar8 = true;
  if (!bVar6) {
    pPVar1 = &state->parse_state;
    pPVar1->mangled_idx = uVar3;
    pPVar1->out_cur_idx = uVar4;
    *(undefined8 *)&(state->parse_state).prev_name_idx = uVar5;
    bVar6 = ParseTwoCharToken(state,"sr");
    if (bVar6) {
      bVar6 = ParseTemplateParam(state);
      if (bVar6) {
        ParseTemplateArgs(state);
      }
      else {
        bVar6 = ParseDecltype(state);
        if (!bVar6) {
          bVar6 = ParseSubstitution(state,false);
          if (!bVar6) goto LAB_00267d2c;
        }
      }
      bVar6 = ParseBaseUnresolvedName(state);
      if (bVar6) goto LAB_00267e82;
    }
LAB_00267d2c:
    pPVar1->mangled_idx = uVar3;
    pPVar1->out_cur_idx = uVar4;
    *(undefined8 *)&(state->parse_state).prev_name_idx = uVar5;
    bVar6 = ParseTwoCharToken(state,"sr");
    if (bVar6) {
      bVar6 = ParseOneCharToken(state,'N');
      if (bVar6) {
        bVar6 = ParseTemplateParam(state);
        if (bVar6) {
          ParseTemplateArgs(state);
        }
        else {
          bVar6 = ParseDecltype(state);
          if (!bVar6) {
            bVar6 = ParseSubstitution(state,false);
            if (!bVar6) goto LAB_00267dc1;
          }
        }
        bVar6 = ParseUnresolvedQualifierLevel(state);
        if (bVar6) {
          do {
            bVar6 = ParseUnresolvedQualifierLevel(state);
          } while (bVar6);
          bVar6 = ParseOneCharToken(state,'E');
          if (bVar6) {
            bVar6 = ParseBaseUnresolvedName(state);
            if (bVar6) goto LAB_00267e82;
          }
        }
      }
    }
LAB_00267dc1:
    pPVar1->mangled_idx = uVar3;
    pPVar1->out_cur_idx = uVar4;
    *(undefined8 *)&(state->parse_state).prev_name_idx = uVar5;
    ParseTwoCharToken(state,"gs");
    bVar6 = ParseTwoCharToken(state,"sr");
    if (bVar6) {
      bVar6 = ParseUnresolvedQualifierLevel(state);
      if (bVar6) {
        do {
          bVar6 = ParseUnresolvedQualifierLevel(state);
        } while (bVar6);
        bVar6 = ParseOneCharToken(state,'E');
        if (bVar6) {
          bVar6 = ParseBaseUnresolvedName(state);
          if (bVar6) goto LAB_00267e82;
        }
      }
    }
    pPVar1->mangled_idx = uVar3;
    pPVar1->out_cur_idx = uVar4;
    *(undefined8 *)&(state->parse_state).prev_name_idx = uVar5;
    bVar6 = ParseTwoCharToken(state,"sr");
    if (bVar6) {
      bVar6 = ParseTwoCharToken(state,"St");
      if (bVar6) {
        bVar6 = ParseSourceName(state);
        if (bVar6) {
          ParseTemplateArgs(state);
          bVar6 = ParseSourceName(state);
          if (bVar6) {
            ParseTemplateArgs(state);
            goto LAB_00267e82;
          }
        }
      }
    }
    pPVar1->mangled_idx = uVar3;
    pPVar1->out_cur_idx = uVar4;
    *(undefined8 *)&(state->parse_state).prev_name_idx = uVar5;
    bVar8 = false;
  }
LAB_00267e82:
  iVar7 = state->recursion_depth + -1;
LAB_00267e87:
  state->recursion_depth = iVar7;
  return bVar8;
}

Assistant:

static bool ParseUnresolvedName(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;

  ParseState copy = state->parse_state;
  if (Optional(ParseTwoCharToken(state, "gs")) &&
      ParseBaseUnresolvedName(state)) {
    return true;
  }
  state->parse_state = copy;

  if (ParseTwoCharToken(state, "sr") && ParseUnresolvedType(state) &&
      ParseBaseUnresolvedName(state)) {
    return true;
  }
  state->parse_state = copy;

  if (ParseTwoCharToken(state, "sr") && ParseOneCharToken(state, 'N') &&
      ParseUnresolvedType(state) &&
      OneOrMore(ParseUnresolvedQualifierLevel, state) &&
      ParseOneCharToken(state, 'E') && ParseBaseUnresolvedName(state)) {
    return true;
  }
  state->parse_state = copy;

  if (Optional(ParseTwoCharToken(state, "gs")) &&
      ParseTwoCharToken(state, "sr") &&
      OneOrMore(ParseUnresolvedQualifierLevel, state) &&
      ParseOneCharToken(state, 'E') && ParseBaseUnresolvedName(state)) {
    return true;
  }
  state->parse_state = copy;

  if (ParseTwoCharToken(state, "sr") && ParseTwoCharToken(state, "St") &&
      ParseSimpleId(state) && ParseSimpleId(state)) {
    return true;
  }
  state->parse_state = copy;

  return false;
}